

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer_cmdhandler.cpp
# Opt level: O0

void __thiscall VGMPlayer::Cmd_PWM_Reg(VGMPlayer *this)

{
  byte bVar1;
  UINT16 UVar2;
  CHIP_DEVICE *pCVar3;
  UINT16 value;
  UINT8 ofs;
  CHIP_DEVICE *cDev;
  UINT8 chipID;
  UINT8 chipType;
  VGMPlayer *this_local;
  
  pCVar3 = GetDevicePtr(this,_CMD_INFO[this->_fileData[this->_filePos]].chipType,'\0');
  if ((pCVar3 != (CHIP_DEVICE *)0x0) && (pCVar3->writeD16 != (DEVFUNC_WRITE_A8D16)0x0)) {
    bVar1 = this->_fileData[(ulong)this->_filePos + 1];
    UVar2 = ReadBE16(this->_fileData + (ulong)this->_filePos + 1);
    (*pCVar3->writeD16)((pCVar3->base).defInf.dataPtr,(UINT8)((int)(uint)bVar1 >> 4),UVar2 & 0xfff);
  }
  return;
}

Assistant:

void VGMPlayer::Cmd_PWM_Reg(void)
{
	UINT8 chipType = _CMD_INFO[fData[0x00]].chipType;
	UINT8 chipID = 0;
	CHIP_DEVICE* cDev = GetDevicePtr(chipType, chipID);
	if (cDev == NULL || cDev->writeD16 == NULL)
		return;
	
	UINT8 ofs = (fData[0x01] >> 4) & 0x0F;
	UINT16 value = ReadBE16(&fData[0x01]) & 0x0FFF;
	cDev->writeD16(cDev->base.defInf.dataPtr, ofs, value);
	return;
}